

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkCollapse_rec(Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vSigs)

{
  int iVar1;
  int iVar2;
  Cba_ObjType_t CVar3;
  int iVar4;
  int *a;
  Cba_Ntk_t *p_00;
  int iVar5;
  int iVar6;
  
  Cba_NtkCleanObjCopies(p);
  Cba_NtkCleanFonCopies(p);
  iVar1 = vSigs->nSize;
  if (iVar1 != (p->vInputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x2e3,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
  }
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vInputs,iVar5);
    iVar1 = Cba_ObjFon0(p,iVar1);
    iVar2 = Vec_IntEntry(vSigs,iVar5);
    Cba_FonSetCopy(p,iVar1,iVar2);
    iVar1 = (p->vInputs).nSize;
  }
  iVar1 = 1;
  while( true ) {
    iVar5 = (p->vObjType).nSize;
    if (iVar5 <= iVar1) break;
    CVar3 = Cba_ObjType(p,iVar1);
    if (CVar3 != CBA_OBJ_NONE) {
      iVar5 = Cba_ObjIsBoxPrim(p,iVar1);
      if (iVar5 == 0) {
        iVar5 = Cba_ObjIsBoxUser(p,iVar1);
        if (iVar5 != 0) {
          iVar5 = Cba_ObjFon0(p,iVar1);
          while( true ) {
            iVar2 = Cba_ObjFon0(p,iVar1 + 1);
            if (iVar2 <= iVar5) break;
            iVar2 = Cba_ObjAlloc(pNew,CBA_BOX_BUF,1,1);
            iVar2 = Cba_ObjFon0(pNew,iVar2);
            Cba_FonSetCopy(p,iVar5,iVar2);
            iVar5 = iVar5 + 1;
          }
        }
      }
      else {
        iVar5 = Cba_ObjDup(pNew,p,iVar1);
        iVar2 = Cba_ObjFon0(p,iVar1);
        iVar6 = 0;
        while( true ) {
          iVar4 = Cba_ObjFon0(p,iVar1 + 1);
          if (iVar4 <= iVar2 + iVar6) break;
          iVar4 = Cba_ObjFon(pNew,iVar5,iVar6);
          Cba_FonSetCopy(p,iVar2 + iVar6,iVar4);
          iVar6 = iVar6 + 1;
        }
        iVar2 = Cba_ObjAttr(p,iVar1);
        if (iVar2 != 0) {
          a = Cba_ObjAttrArray(p,iVar1);
          iVar2 = Cba_ObjAttrSize(p,iVar1);
          Cba_ObjSetAttrs(pNew,iVar5,a,iVar2);
        }
      }
    }
    iVar1 = iVar1 + 1;
  }
  iVar1 = 1;
  do {
    if (iVar5 <= iVar1) {
      vSigs->nSize = 0;
      for (iVar1 = 0; iVar1 < (p->vOutputs).nSize; iVar1 = iVar1 + 1) {
        iVar5 = Vec_IntEntry(&p->vOutputs,iVar1);
        iVar5 = Cba_ObjFinFon(p,iVar5,0);
        iVar5 = Cba_FonCopy(p,iVar5);
        Vec_IntPush(vSigs,iVar5);
      }
      return;
    }
    CVar3 = Cba_ObjType(p,iVar1);
    if (CVar3 != CBA_OBJ_NONE) {
      iVar5 = Cba_ObjIsBoxPrim(p,iVar1);
      if (iVar5 == 0) {
        iVar5 = Cba_ObjIsBoxUser(p,iVar1);
        if (iVar5 != 0) {
          vSigs->nSize = 0;
          iVar5 = Cba_ObjFin0(p,iVar1);
          while( true ) {
            iVar2 = Cba_ObjFin0(p,iVar1 + 1);
            if (iVar2 <= iVar5) break;
            iVar2 = Cba_FinFon(p,iVar5);
            iVar2 = Cba_FonCopy(p,iVar2);
            Vec_IntPush(vSigs,iVar2);
            iVar5 = iVar5 + 1;
          }
          iVar5 = vSigs->nSize;
          iVar2 = Cba_ObjFinNum(p,iVar1);
          if (iVar5 != iVar2) {
            __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                          ,0x305,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
          }
          p_00 = Cba_ObjNtk(p,iVar1);
          Cba_NtkCollapse_rec(pNew,p_00,vSigs);
          iVar5 = vSigs->nSize;
          iVar2 = Cba_ObjFonNum(p,iVar1);
          if (iVar5 != iVar2) {
            __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                          ,0x307,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
          }
          iVar5 = Cba_ObjFon0(p,iVar1);
          iVar2 = 0;
          while( true ) {
            iVar6 = Cba_ObjFon0(p,iVar1 + 1);
            if (iVar6 <= iVar2 + iVar5) break;
            iVar6 = Cba_FonCopy(p,iVar2 + iVar5);
            iVar6 = Cba_FonObj(pNew,iVar6);
            iVar4 = Vec_IntEntry(vSigs,iVar2);
            Cba_ObjSetFinFon(pNew,iVar6,0,iVar4);
            iVar2 = iVar2 + 1;
          }
        }
      }
      else {
        iVar5 = Cba_ObjCopy(p,iVar1);
        iVar2 = Cba_ObjFin0(p,iVar1);
        iVar6 = 0;
        while( true ) {
          iVar4 = Cba_ObjFin0(p,iVar1 + 1);
          if (iVar4 <= iVar2 + iVar6) break;
          iVar4 = Cba_FinFon(p,iVar2 + iVar6);
          iVar4 = Cba_FonCopy(p,iVar4);
          Cba_ObjSetFinFon(pNew,iVar5,iVar6,iVar4);
          iVar6 = iVar6 + 1;
        }
      }
    }
    iVar1 = iVar1 + 1;
    iVar5 = (p->vObjType).nSize;
  } while( true );
}

Assistant:

void Cba_NtkCollapse_rec( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(p) );
    Cba_NtkForEachPiFon( p, iObj, iFon, i )
        Cba_FonSetCopy( p, iFon, Vec_IntEntry(vSigs, i) );
    // duplicate primitives and create buffers for user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjDup( pNew, p, iObj );
            Cba_ObjForEachFon( p, iObj, iFon, i )
                Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, i) );
            if ( Cba_ObjAttr(p, iObj) )
                Cba_ObjSetAttrs( pNew, iObjNew, Cba_ObjAttrArray(p, iObj), Cba_ObjAttrSize(p, iObj) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_ObjAlloc( pNew, CBA_BOX_BUF, 1, 1 );
                Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
            }
        }
    // connect primitives and collapse user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjCopy( p, iObj );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Cba_ObjSetFinFon( pNew, iObjNew, i, Cba_FonCopy(p, iFon) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Vec_IntClear( vSigs );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
            assert( Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj) );
            Cba_NtkCollapse_rec( pNew, Cba_ObjNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj) );
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_FonObj( pNew, Cba_FonCopy(p, iFon) ); // buffer
                Cba_ObjSetFinFon( pNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
            }
        }
    // collect POs
    Vec_IntClear( vSigs );
    Cba_NtkForEachPoDriverFon( p, iObj, iFon, i )
        Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
}